

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O3

void __thiscall PatternBlock::normalize(PatternBlock *this)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  pointer puVar8;
  pointer puVar9;
  uint *puVar10;
  uint uVar11;
  size_t __n;
  uint *puVar12;
  uint *puVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  pointer __src;
  pointer __src_00;
  pointer puVar17;
  
  if (this->nonzerosize < 1) {
    this->offset = 0;
    puVar17 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar17) {
      (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar17;
    }
    puVar17 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish == puVar17) {
      return;
    }
    (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar17;
    return;
  }
  puVar17 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar9 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __src_00 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (puVar17 != puVar9) {
    iVar5 = this->offset;
    puVar8 = puVar17;
    do {
      iVar5 = iVar5 + 4;
      __src = puVar8;
      if (*puVar8 != 0) break;
      puVar8 = puVar8 + 1;
      __src_00 = __src_00 + 1;
      this->offset = iVar5;
      __src = puVar9;
    } while (puVar8 != puVar9);
    if (__src != puVar17) {
      puVar8 = __src;
      if ((long)puVar9 - (long)__src != 0) {
        memmove(puVar17,__src,(long)puVar9 - (long)__src);
        puVar8 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      puVar17 = (pointer)((long)puVar17 + ((long)puVar8 - (long)__src));
      if (puVar8 != puVar17) {
        (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar17;
      }
    }
  }
  puVar17 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (__src_00 != puVar17) {
    __n = (long)(this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)__src_00;
    puVar9 = __src_00;
    if (__n != 0) {
      memmove(puVar17,__src_00,__n);
      puVar9 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    puVar17 = (pointer)((long)puVar17 + ((long)puVar9 - (long)__src_00));
    if (puVar9 != puVar17) {
      (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar17;
    }
  }
  puVar2 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar13 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar2 == puVar13) goto LAB_00330fc9;
  puVar12 = puVar13;
  if (*puVar2 == 0) {
    iVar6 = 0;
    iVar5 = 4;
LAB_00330eea:
    this->offset = this->offset + iVar5;
    lVar14 = (long)puVar13 - (long)puVar2 >> 2;
    bVar7 = (byte)(iVar5 << 3);
    if (lVar14 != 1) {
      uVar11 = *puVar2;
      lVar15 = 1;
      do {
        uVar16 = uVar11 << (bVar7 & 0x1f);
        uVar11 = puVar2[lVar15];
        puVar2[lVar15 + -1] = uVar11 >> ((char)iVar6 * '\b' & 0x1fU) | uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar14 != lVar15);
    }
    puVar13[-1] = puVar13[-1] << (bVar7 & 0x1f);
    puVar10 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar17 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish;
    lVar14 = (long)puVar17 - (long)puVar10 >> 2;
    if (lVar14 != 1) {
      uVar11 = *puVar10;
      lVar15 = 1;
      do {
        uVar16 = uVar11 << (bVar7 & 0x1f);
        uVar11 = puVar10[lVar15];
        puVar10[lVar15 + -1] = uVar11 >> ((byte)(iVar6 << 3) & 0x1f) | uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar14 != lVar15);
    }
    puVar17[-1] = puVar17[-1] << (bVar7 & 0x1f);
    puVar9 = puVar17;
  }
  else {
    uVar11 = *puVar2;
    iVar5 = -4;
    do {
      iVar6 = iVar5;
      iVar5 = iVar6 + 1;
      bVar3 = 0xff < uVar11;
      uVar11 = uVar11 >> 8;
    } while (bVar3);
    if (iVar5 != 0) {
      iVar5 = -iVar5;
      iVar6 = iVar6 + 5;
      goto LAB_00330eea;
    }
    puVar17 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish;
    puVar9 = puVar17;
  }
  do {
    puVar10 = puVar12;
    if (puVar12 == puVar2) break;
    puVar10 = puVar12 + -1;
    puVar17 = puVar17 + -1;
    puVar1 = puVar12 + -1;
    puVar12 = puVar10;
  } while (*puVar1 == 0);
  puVar10 = puVar10 + 1;
  if (puVar10 != puVar13) {
    (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar10;
    puVar13 = puVar10;
  }
  if (puVar17 + 1 != puVar9) {
    (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar17 + 1;
  }
LAB_00330fc9:
  if (puVar2 == puVar13) {
    this->offset = 0;
    this->nonzerosize = 0;
  }
  else {
    uVar16 = (int)puVar13 - (int)puVar2 & 0xfffffffc;
    this->nonzerosize = uVar16;
    uVar11 = puVar13[-1];
    if ((char)uVar11 == '\0') {
      do {
        uVar16 = uVar16 - 1;
        uVar4 = uVar11 & 0xff00;
        uVar11 = uVar11 >> 8;
      } while (uVar4 == 0);
      this->nonzerosize = uVar16;
    }
  }
  return;
}

Assistant:

void PatternBlock::normalize(void)

{
  if (nonzerosize<=0) {		// Check if alwaystrue or alwaysfalse
    offset = 0;			// in which case we don't need mask and value
    maskvec.clear();
    valvec.clear();
    return;
  }
  vector<uintm>::iterator iter1,iter2;
  
  iter1 = maskvec.begin();	// Cut zeros from beginning of mask
  iter2 = valvec.begin();
  while((iter1 != maskvec.end())&&((*iter1)==0)) {
    iter1++;
    iter2++;
    offset += sizeof(uintm);
  }
  maskvec.erase(maskvec.begin(),iter1);
  valvec.erase(valvec.begin(),iter2);

  if (!maskvec.empty()) {
    int4 suboff = 0;		// Cut off unaligned zeros from beginning of mask
    uintm tmp = maskvec[0];
    while(tmp != 0) {
      suboff += 1;
      tmp >>= 8;
    }
    suboff = sizeof(uintm)-suboff;
    if (suboff != 0) {
      offset += suboff;		// Slide up maskvec by suboff bytes
      for(int4 i=0;i<maskvec.size()-1;++i) {
	tmp = maskvec[i] << (suboff*8);
	tmp |= (maskvec[i+1] >> ((sizeof(uintm)-suboff)*8));
	maskvec[i] = tmp;
      }
      maskvec.back() <<= suboff*8;
      for(int4 i=0;i<valvec.size()-1;++i) { // Slide up valvec by suboff bytes
	tmp = valvec[i] << (suboff*8);
	tmp |= (valvec[i+1] >> ((sizeof(uintm)-suboff)*8));
	valvec[i] = tmp;
      }
      valvec.back() <<= suboff*8;
    }
    
    iter1 = maskvec.end();	// Cut zeros from end of mask
    iter2 = valvec.end();
    while(iter1 != maskvec.begin()) {
      --iter1;
      --iter2;
      if ((*iter1) != 0) break; // Find last non-zero
    }
    if (iter1 != maskvec.end()) {
      iter1++;			// Find first zero, in last zero chain
      iter2++;
    }
    maskvec.erase(iter1,maskvec.end());
    valvec.erase(iter2,valvec.end());
  }

  if (maskvec.empty()) {
    offset = 0;
    nonzerosize = 0;		// Always true
    return;
  }
  nonzerosize = maskvec.size() * sizeof(uintm);
  uintm tmp = maskvec.back();	// tmp must be nonzero
  while( (tmp&0xff) == 0) {
    nonzerosize -= 1;
    tmp >>= 8;
  }
}